

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512_mula2(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 (*pauVar5) [64];
  uint32_t *puVar6;
  int j;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar38 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 0x40) {
    *(undefined8 *)(local_480 + lVar4) = 0;
    *(undefined8 *)(local_480 + lVar4 + 8) = 0;
    *(undefined8 *)(local_480 + lVar4 + 0x10) = 0;
    *(undefined8 *)(local_480 + lVar4 + 0x18) = 0;
    *(undefined8 *)(local_480 + lVar4 + 0x20) = 0;
    *(undefined8 *)(local_480 + lVar4 + 0x28) = 0;
    *(undefined8 *)(local_480 + lVar4 + 0x30) = 0;
    *(undefined8 *)(local_480 + lVar4 + 0x38) = 0;
  }
  auVar9 = vmovdqa64_avx512f(local_480);
  auVar10 = vmovdqa64_avx512f(local_440);
  auVar11 = vmovdqa64_avx512f(local_400);
  auVar12 = vmovdqa64_avx512f(local_3c0);
  auVar13 = vmovdqa64_avx512f(local_380);
  auVar14 = vmovdqa64_avx512f(local_340);
  auVar15 = vmovdqa64_avx512f(local_300);
  auVar16 = vmovdqa64_avx512f(local_2c0);
  auVar17 = vmovdqa64_avx512f(local_280);
  auVar18 = vmovdqa64_avx512f(local_180);
  auVar19 = vmovdqa64_avx512f(local_240);
  auVar20 = vmovdqa64_avx512f(local_140);
  auVar21 = vmovdqa64_avx512f(local_200);
  auVar22 = vmovdqa64_avx512f(local_100);
  auVar23 = vmovdqa64_avx512f(local_1c0);
  auVar24 = vmovdqa64_avx512f(local_c0);
  pauVar5 = (undefined1 (*) [64])(data + 0x20);
  uVar7 = 2;
  auVar25 = vmovdqa64_avx512f(_DAT_00117a40);
  auVar26 = vmovdqa64_avx512f(_DAT_00117a80);
  auVar27 = vpbroadcastb_avx512bw(ZEXT116(0x11));
  auVar28 = vpbroadcastq_avx512f(ZEXT816(0xf));
  auVar8 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar38 = ZEXT1664(auVar8);
  while (uVar7 <= len >> 5) {
    auVar29 = vmovdqu64_avx512f(pauVar5[-1]);
    auVar30 = vmovdqu64_avx512f(*pauVar5);
    pauVar5 = pauVar5 + 2;
    uVar7 = uVar7 + 2;
    auVar31 = vmovdqa64_avx512f(auVar29);
    auVar31 = vpermt2b_avx512_vbmi(auVar31,auVar25,auVar30);
    auVar29 = vpermt2b_avx512_vbmi(auVar30,auVar26,auVar29);
    auVar30 = vpsrld_avx512f(auVar31,1);
    auVar32 = vpsrld_avx512f(auVar31,2);
    auVar33 = vpsrld_avx512f(auVar31,3);
    auVar31 = vpandq_avx512f(auVar31,auVar27);
    auVar34 = vpsrld_avx512f(auVar29,1);
    auVar35 = vpsrld_avx512f(auVar29,2);
    auVar36 = vpsrld_avx512f(auVar29,3);
    auVar29 = vpandq_avx512f(auVar29,auVar27);
    auVar32 = vpandq_avx512f(auVar32,auVar27);
    auVar31 = vpsadbw_avx512bw(auVar31,auVar38);
    auVar33 = vpandq_avx512f(auVar33,auVar27);
    auVar34 = vpandq_avx512f(auVar34,auVar27);
    auVar29 = vpsadbw_avx512bw(auVar29,auVar38);
    auVar35 = vpandq_avx512f(auVar35,auVar27);
    auVar30 = vpandq_avx512f(auVar30,auVar27);
    auVar36 = vpandq_avx512f(auVar36,auVar27);
    auVar32 = vpsadbw_avx512bw(auVar32,auVar38);
    auVar33 = vpsadbw_avx512bw(auVar33,auVar38);
    auVar34 = vpsadbw_avx512bw(auVar34,auVar38);
    auVar35 = vpsadbw_avx512bw(auVar35,auVar38);
    auVar30 = vpsadbw_avx512bw(auVar30,auVar38);
    auVar36 = vpsadbw_avx512bw(auVar36,auVar38);
    auVar37 = vpandq_avx512f(auVar31,auVar28);
    auVar31 = vpsrld_avx512f(auVar31,4);
    auVar13 = vpaddq_avx512f(auVar13,auVar31);
    auVar31 = vpandq_avx512f(auVar32,auVar28);
    auVar32 = vpsrld_avx512f(auVar32,4);
    auVar9 = vpaddq_avx512f(auVar9,auVar37);
    auVar37 = vpandq_avx512f(auVar30,auVar28);
    auVar30 = vpsrld_avx512f(auVar30,4);
    auVar11 = vpaddq_avx512f(auVar11,auVar31);
    auVar31 = vpandq_avx512f(auVar33,auVar28);
    auVar15 = vpaddq_avx512f(auVar15,auVar32);
    auVar32 = vpsrld_avx512f(auVar33,4);
    auVar10 = vpaddq_avx512f(auVar10,auVar37);
    auVar14 = vpaddq_avx512f(auVar14,auVar30);
    auVar12 = vpaddq_avx512f(auVar12,auVar31);
    auVar30 = vpandq_avx512f(auVar29,auVar28);
    auVar29 = vpsrld_avx512f(auVar29,4);
    auVar16 = vpaddq_avx512f(auVar16,auVar32);
    auVar17 = vpaddq_avx512f(auVar17,auVar30);
    auVar18 = vpaddq_avx512f(auVar18,auVar29);
    auVar29 = vpandq_avx512f(auVar34,auVar28);
    auVar30 = vpsrld_avx512f(auVar34,4);
    auVar19 = vpaddq_avx512f(auVar19,auVar29);
    auVar20 = vpaddq_avx512f(auVar20,auVar30);
    auVar29 = vpandq_avx512f(auVar35,auVar28);
    auVar30 = vpsrld_avx512f(auVar35,4);
    auVar21 = vpaddq_avx512f(auVar21,auVar29);
    auVar22 = vpaddq_avx512f(auVar22,auVar30);
    auVar29 = vpandq_avx512f(auVar36,auVar28);
    auVar30 = vpsrld_avx512f(auVar36,4);
    auVar23 = vpaddq_avx512f(auVar23,auVar29);
    auVar24 = vpaddq_avx512f(auVar24,auVar30);
  }
  local_380 = vmovdqa64_avx512f(auVar13);
  local_440 = vmovdqa64_avx512f(auVar10);
  local_340 = vmovdqa64_avx512f(auVar14);
  local_400 = vmovdqa64_avx512f(auVar11);
  local_300 = vmovdqa64_avx512f(auVar15);
  local_3c0 = vmovdqa64_avx512f(auVar12);
  local_2c0 = vmovdqa64_avx512f(auVar16);
  local_280 = vmovdqa64_avx512f(auVar17);
  local_180 = vmovdqa64_avx512f(auVar18);
  local_240 = vmovdqa64_avx512f(auVar19);
  local_140 = vmovdqa64_avx512f(auVar20);
  local_200 = vmovdqa64_avx512f(auVar21);
  local_100 = vmovdqa64_avx512f(auVar22);
  local_1c0 = vmovdqa64_avx512f(auVar23);
  local_c0 = vmovdqa64_avx512f(auVar24);
  local_480 = vmovdqa64_avx512f(auVar9);
  lVar4 = 0;
  puVar6 = flags;
  while (lVar4 != 0x100) {
    auVar8 = vpaddq_avx(*(undefined1 (*) [16])(local_440 + lVar4 * 4 + -0x10),
                        *(undefined1 (*) [16])(local_480 + lVar4 * 4 + 0x20));
    auVar2 = vpaddq_avx(*(undefined1 (*) [16])(local_480 + lVar4 * 4 + 0x10),
                        *(undefined1 (*) [16])(local_480 + lVar4 * 4));
    lVar4 = lVar4 + 0x10;
    auVar3 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpaddq_avx(auVar8,auVar3);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpaddq_avx(auVar2,auVar3);
    *puVar6 = auVar8._0_4_ + auVar2._0_4_;
    puVar6 = puVar6 + 1;
  }
  for (uVar7 = (ulong)(len & 0xffffffc0); uVar7 < len; uVar7 = uVar7 + 1) {
    uVar1 = data[uVar7];
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      flags[lVar4] = flags[lVar4] + (uint)((uVar1 >> ((uint)lVar4 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512_mula2(const uint16_t* data, uint32_t len, uint32_t* flags) {
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    __m512i sum[16];
    for (int i=0; i < 16; ++i)
        sum[i] = _mm512_setzero_si512();

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16(0x00FF)), _mm512_slli_epi16(v1, 8));
        __m512i input1 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16((int16_t)0xFF00)), _mm512_srli_epi16(v1, 8));
        
        const __m512i bits_04 = _mm512_and_si512(input0, _mm512_set1_epi16(0x1111));
        const __m512i bits_15 = _mm512_and_si512(_mm512_srli_epi32(input0, 1), _mm512_set1_epi16(0x1111)); // 00010001 00010001
        const __m512i bits_26 = _mm512_and_si512(_mm512_srli_epi32(input0, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_37 = _mm512_and_si512(_mm512_srli_epi32(input0, 3), _mm512_set1_epi16(0x1111));

        const __m512i bits_8c = _mm512_and_si512(input1, _mm512_set1_epi16(0x1111));
        const __m512i bits_9d = _mm512_and_si512(_mm512_srli_epi32(input1, 1), _mm512_set1_epi16(0x1111));
        const __m512i bits_ae = _mm512_and_si512(_mm512_srli_epi32(input1, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_bf = _mm512_and_si512(_mm512_srli_epi32(input1, 3), _mm512_set1_epi16(0x1111));

        const __m512i sum_04 = _mm512_sad_epu8(bits_04, _mm512_setzero_si512());
        const __m512i sum_15 = _mm512_sad_epu8(bits_15, _mm512_setzero_si512());
        const __m512i sum_26 = _mm512_sad_epu8(bits_26, _mm512_setzero_si512());
        const __m512i sum_37 = _mm512_sad_epu8(bits_37, _mm512_setzero_si512());

        const __m512i sum_8c = _mm512_sad_epu8(bits_8c, _mm512_setzero_si512());
        const __m512i sum_9d = _mm512_sad_epu8(bits_9d, _mm512_setzero_si512());
        const __m512i sum_ae = _mm512_sad_epu8(bits_ae, _mm512_setzero_si512());
        const __m512i sum_bf = _mm512_sad_epu8(bits_bf, _mm512_setzero_si512());

        sum[0x0] = _mm512_add_epi64(sum[0x0], _mm512_and_si512 (sum_04, _mm512_set1_epi64(0xF))); // 00001111
        sum[0x4] = _mm512_add_epi64(sum[0x4], _mm512_srli_epi32(sum_04, 4));
        sum[0x1] = _mm512_add_epi64(sum[0x1], _mm512_and_si512 (sum_15, _mm512_set1_epi64(0xF)));
        sum[0x5] = _mm512_add_epi64(sum[0x5], _mm512_srli_epi32(sum_15, 4));
        sum[0x2] = _mm512_add_epi64(sum[0x2], _mm512_and_si512 (sum_26, _mm512_set1_epi64(0xF)));
        sum[0x6] = _mm512_add_epi64(sum[0x6], _mm512_srli_epi32(sum_26, 4));
        sum[0x3] = _mm512_add_epi64(sum[0x3], _mm512_and_si512 (sum_37, _mm512_set1_epi64(0xF)));
        sum[0x7] = _mm512_add_epi64(sum[0x7], _mm512_srli_epi32(sum_37, 4));
        sum[0x8] = _mm512_add_epi64(sum[0x8], _mm512_and_si512 (sum_8c, _mm512_set1_epi64(0xF)));
        sum[0xc] = _mm512_add_epi64(sum[0xc], _mm512_srli_epi32(sum_8c, 4));
        sum[0x9] = _mm512_add_epi64(sum[0x9], _mm512_and_si512 (sum_9d, _mm512_set1_epi64(0xF)));
        sum[0xd] = _mm512_add_epi64(sum[0xd], _mm512_srli_epi32(sum_9d, 4));
        sum[0xa] = _mm512_add_epi64(sum[0xa], _mm512_and_si512 (sum_ae, _mm512_set1_epi64(0xF)));
        sum[0xe] = _mm512_add_epi64(sum[0xe], _mm512_srli_epi32(sum_ae, 4));
        sum[0xb] = _mm512_add_epi64(sum[0xb], _mm512_and_si512 (sum_bf, _mm512_set1_epi64(0xF)));
        sum[0xf] = _mm512_add_epi64(sum[0xf], _mm512_srli_epi32(sum_bf, 4));
    }

    for (int j = 0; j < 16; ++j) {
        const __m128i dq0 = _mm512_extracti32x4_epi32(sum[j], 0);
        const __m128i dq1 = _mm512_extracti32x4_epi32(sum[j], 1);
        const __m128i dq2 = _mm512_extracti32x4_epi32(sum[j], 2);
        const __m128i dq3 = _mm512_extracti32x4_epi32(sum[j], 3);
        flags[j] = _mm_extract_epi64(dq0, 0)
                    + _mm_extract_epi64(dq0, 1)
                    + _mm_extract_epi64(dq1, 0)
                    + _mm_extract_epi64(dq1, 1)
                    + _mm_extract_epi64(dq2, 0)
                    + _mm_extract_epi64(dq2, 1)
                    + _mm_extract_epi64(dq3, 0)
                    + _mm_extract_epi64(dq3, 1);
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}